

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong length;
  long local_950;
  size_t code;
  size_t i;
  uint16_t bits [272];
  uint8_t depths [272];
  uint32_t histogram [272];
  size_t alphabet_size;
  size_t repeat_bits;
  size_t repeat_code;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  HuffmanTree *tree_local;
  size_t context_bits_local;
  size_t num_types_local;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    uVar3 = context_bits - 1;
    uVar2 = (1 << ((byte)uVar3 & 0x1f)) - 1;
    length = num_types + uVar3;
    memset(depths + 0x108,0,length * 4);
    *(ulong *)(storage + (*storage_ix >> 3)) =
         1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 1;
    if (context_bits - 2 >> 4 != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(size_t *)(storage + (*storage_ix >> 3)) =
         context_bits - 2 << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 4;
    histogram[context_bits - 3] = (uint32_t)num_types;
    depths[0x108] = '\x01';
    depths[0x109] = '\0';
    depths[0x10a] = '\0';
    depths[0x10b] = '\0';
    for (code = context_bits; code < length; code = code + 1) {
      histogram[code - 2] = 1;
    }
    BuildAndStoreHuffmanTree
              ((uint32_t *)(depths + 0x108),length,tree,(uint8_t *)(bits + 0x10c),(uint16_t *)&i,
               storage_ix,storage);
    for (code = 0; code < num_types; code = code + 1) {
      if (code == 0) {
        local_950 = 0;
      }
      else {
        local_950 = code + context_bits + -1;
      }
      bVar1 = *(byte *)((long)bits + local_950 + 0x218);
      if (bits[local_950 + -4] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)bits[local_950 + -4] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)bVar1 + *storage_ix;
      bVar1 = *(byte *)((long)bits + context_bits + 0x217);
      if (bits[context_bits - 5] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)bits[context_bits - 5] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)bVar1 + *storage_ix;
      if (uVar2 >> ((byte)uVar3 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < uVar3) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)uVar2 << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = uVar3 + *storage_ix;
    }
    *(ulong *)(storage + (*storage_ix >> 3)) =
         1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 1;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, tree,
                             depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}